

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_dx_iface.c
# Opt level: O0

aom_codec_err_t
parse_operating_points(aom_read_bit_buffer *rb,int is_reduced_header,aom_codec_stream_info_t *si)

{
  char cVar1;
  char cVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  aom_codec_err_t aVar6;
  long in_RDX;
  int in_ESI;
  uint8_t initial_display_delay_present_for_this_op;
  uint8_t decoder_model_present_for_this_op;
  int seq_level_idx;
  int operating_point_idc;
  int i;
  uint8_t operating_points_cnt_minus_1;
  uint8_t initial_display_delay_present_flag;
  uint8_t timing_info_present_flag;
  aom_codec_err_t status;
  int buffer_delay_length_minus_1;
  uint8_t decoder_model_info_present_flag;
  int operating_point_idc0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined2 in_stack_ffffffffffffffbc;
  char in_stack_ffffffffffffffbe;
  char in_stack_ffffffffffffffbf;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcc;
  undefined1 in_stack_ffffffffffffffcd;
  undefined1 in_stack_ffffffffffffffce;
  undefined1 in_stack_ffffffffffffffcf;
  aom_codec_err_t in_stack_ffffffffffffffd0;
  undefined4 uVar7;
  char local_25;
  int local_24;
  aom_codec_err_t local_4;
  
  local_24 = 0;
  if (in_ESI == 0) {
    local_25 = '\0';
    uVar7 = 0;
    iVar4 = aom_rb_read_bit((aom_read_bit_buffer *)
                            CONCAT17(in_stack_ffffffffffffffcf,
                                     CONCAT16(in_stack_ffffffffffffffce,
                                              CONCAT15(in_stack_ffffffffffffffcd,
                                                       CONCAT14(in_stack_ffffffffffffffcc,
                                                                in_stack_ffffffffffffffc8)))));
    cVar1 = (char)iVar4;
    if (cVar1 != '\0') {
      in_stack_ffffffffffffffd0 =
           parse_timing_info((aom_read_bit_buffer *)
                             CONCAT17(cVar1,CONCAT16(in_stack_ffffffffffffffce,
                                                     CONCAT15(in_stack_ffffffffffffffcd,
                                                              CONCAT14(in_stack_ffffffffffffffcc,
                                                                       in_stack_ffffffffffffffc8))))
                            );
      if (in_stack_ffffffffffffffd0 != AOM_CODEC_OK) {
        return in_stack_ffffffffffffffd0;
      }
      iVar4 = aom_rb_read_bit((aom_read_bit_buffer *)
                              CONCAT17(cVar1,CONCAT16(in_stack_ffffffffffffffce,
                                                      CONCAT15(in_stack_ffffffffffffffcd,
                                                               CONCAT14(in_stack_ffffffffffffffcc,
                                                                        in_stack_ffffffffffffffc8)))
                                      ));
      local_25 = (char)iVar4;
      if (local_25 != '\0') {
        aVar6 = parse_decoder_model_info
                          ((aom_read_bit_buffer *)
                           CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                           (int *)CONCAT17(in_stack_ffffffffffffffbf,
                                           CONCAT16(in_stack_ffffffffffffffbe,
                                                    CONCAT24(in_stack_ffffffffffffffbc,
                                                             in_stack_ffffffffffffffb8))));
        if (aVar6 != AOM_CODEC_OK) {
          return aVar6;
        }
        in_stack_ffffffffffffffd0 = AOM_CODEC_OK;
      }
    }
    iVar4 = aom_rb_read_bit((aom_read_bit_buffer *)
                            CONCAT17(cVar1,CONCAT16(in_stack_ffffffffffffffce,
                                                    CONCAT15(in_stack_ffffffffffffffcd,
                                                             CONCAT14(in_stack_ffffffffffffffcc,
                                                                      in_stack_ffffffffffffffc8)))))
    ;
    cVar2 = (char)iVar4;
    iVar4 = aom_rb_read_literal((aom_read_bit_buffer *)
                                CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                                CONCAT13(in_stack_ffffffffffffffbf,
                                         CONCAT12(in_stack_ffffffffffffffbe,
                                                  in_stack_ffffffffffffffbc)));
    bVar3 = (byte)iVar4;
    for (iVar4 = 0; iVar4 < (int)(bVar3 + 1); iVar4 = iVar4 + 1) {
      in_stack_ffffffffffffffc4 =
           aom_rb_read_literal((aom_read_bit_buffer *)
                               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                               CONCAT13(in_stack_ffffffffffffffbf,
                                        CONCAT12(in_stack_ffffffffffffffbe,in_stack_ffffffffffffffbc
                                                )));
      if (iVar4 == 0) {
        local_24 = in_stack_ffffffffffffffc4;
      }
      in_stack_ffffffffffffffc0 =
           aom_rb_read_literal((aom_read_bit_buffer *)
                               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                               CONCAT13(in_stack_ffffffffffffffbf,
                                        CONCAT12(in_stack_ffffffffffffffbe,in_stack_ffffffffffffffbc
                                                )));
      if (7 < in_stack_ffffffffffffffc0) {
        aom_rb_read_bit((aom_read_bit_buffer *)
                        CONCAT17(cVar1,CONCAT16(cVar2,CONCAT15(bVar3,CONCAT14(
                                                  in_stack_ffffffffffffffcc,iVar4)))));
      }
      if (local_25 != '\0') {
        iVar5 = aom_rb_read_bit((aom_read_bit_buffer *)
                                CONCAT17(cVar1,CONCAT16(cVar2,CONCAT15(bVar3,CONCAT14(
                                                  in_stack_ffffffffffffffcc,iVar4)))));
        in_stack_ffffffffffffffbf = (char)iVar5;
        if (in_stack_ffffffffffffffbf != '\0') {
          aVar6 = parse_op_parameters_info
                            ((aom_read_bit_buffer *)CONCAT44(uVar7,in_stack_ffffffffffffffd0),
                             CONCAT13(cVar1,CONCAT12(cVar2,CONCAT11(bVar3,in_stack_ffffffffffffffcc)
                                                    )));
          if (aVar6 != AOM_CODEC_OK) {
            return aVar6;
          }
          in_stack_ffffffffffffffd0 = AOM_CODEC_OK;
        }
      }
      if (cVar2 != '\0') {
        iVar5 = aom_rb_read_bit((aom_read_bit_buffer *)
                                CONCAT17(cVar1,CONCAT16(cVar2,CONCAT15(bVar3,CONCAT14(
                                                  in_stack_ffffffffffffffcc,iVar4)))));
        in_stack_ffffffffffffffbe = (char)iVar5;
        if (in_stack_ffffffffffffffbe != '\0') {
          aom_rb_read_literal((aom_read_bit_buffer *)
                              CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                              CONCAT13(in_stack_ffffffffffffffbf,
                                       CONCAT12(in_stack_ffffffffffffffbe,in_stack_ffffffffffffffbc)
                                      ));
        }
      }
    }
  }
  else {
    aom_rb_read_literal((aom_read_bit_buffer *)
                        CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        CONCAT13(in_stack_ffffffffffffffbf,
                                 CONCAT12(in_stack_ffffffffffffffbe,in_stack_ffffffffffffffbc)));
  }
  aVar6 = aom_get_num_layers_from_operating_point_idc
                    (local_24,(uint *)(in_RDX + 0xc),(uint *)(in_RDX + 0x10));
  local_4 = (aom_codec_err_t)(aVar6 != AOM_CODEC_OK);
  return local_4;
}

Assistant:

static aom_codec_err_t parse_operating_points(struct aom_read_bit_buffer *rb,
                                              int is_reduced_header,
                                              aom_codec_stream_info_t *si) {
  int operating_point_idc0 = 0;
  if (is_reduced_header) {
    aom_rb_read_literal(rb, LEVEL_BITS);  // level
  } else {
    uint8_t decoder_model_info_present_flag = 0;
    int buffer_delay_length_minus_1 = 0;
    aom_codec_err_t status;
    const uint8_t timing_info_present_flag = aom_rb_read_bit(rb);
    if (timing_info_present_flag) {
      if ((status = parse_timing_info(rb)) != AOM_CODEC_OK) return status;
      decoder_model_info_present_flag = aom_rb_read_bit(rb);
      if (decoder_model_info_present_flag) {
        if ((status = parse_decoder_model_info(
                 rb, &buffer_delay_length_minus_1)) != AOM_CODEC_OK)
          return status;
      }
    }
    const uint8_t initial_display_delay_present_flag = aom_rb_read_bit(rb);
    const uint8_t operating_points_cnt_minus_1 =
        aom_rb_read_literal(rb, OP_POINTS_CNT_MINUS_1_BITS);
    for (int i = 0; i < operating_points_cnt_minus_1 + 1; i++) {
      int operating_point_idc;
      operating_point_idc = aom_rb_read_literal(rb, OP_POINTS_IDC_BITS);
      if (i == 0) operating_point_idc0 = operating_point_idc;
      int seq_level_idx = aom_rb_read_literal(rb, LEVEL_BITS);  // level
      if (seq_level_idx > 7) aom_rb_read_bit(rb);               // tier
      if (decoder_model_info_present_flag) {
        const uint8_t decoder_model_present_for_this_op = aom_rb_read_bit(rb);
        if (decoder_model_present_for_this_op) {
          if ((status = parse_op_parameters_info(
                   rb, buffer_delay_length_minus_1)) != AOM_CODEC_OK)
            return status;
        }
      }
      if (initial_display_delay_present_flag) {
        const uint8_t initial_display_delay_present_for_this_op =
            aom_rb_read_bit(rb);
        if (initial_display_delay_present_for_this_op)
          aom_rb_read_literal(rb, 4);  // initial_display_delay_minus_1
      }
    }
  }

  if (aom_get_num_layers_from_operating_point_idc(
          operating_point_idc0, &si->number_spatial_layers,
          &si->number_temporal_layers) != AOM_CODEC_OK) {
    return AOM_CODEC_ERROR;
  }

  return AOM_CODEC_OK;
}